

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void equality_suite::compare_null_equal_boolean_literal(void)

{
  undefined1 local_199;
  basic_variable<std::allocator<char>_> local_198;
  bool local_15d;
  undefined1 local_15c [2];
  undefined1 local_15a;
  bool local_159;
  basic_variable<std::allocator<char>_> local_158;
  undefined1 local_11c [2];
  undefined1 local_11a;
  bool local_119;
  basic_variable<std::allocator<char>_> local_118;
  undefined1 local_db [2];
  undefined1 local_d9;
  basic_variable<std::allocator<char>_> local_d8;
  bool local_9d;
  undefined1 local_9c [2];
  undefined1 local_9a;
  bool local_99;
  basic_variable<std::allocator<char>_> local_98;
  undefined1 local_5e [20];
  undefined1 local_4a;
  bool local_49;
  basic_variable<std::allocator<char>_> local_48;
  undefined1 local_a [2];
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_48);
  local_49 = false;
  local_a[0] = trial::dynamic::operator==(&local_48,&local_49);
  local_4a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable() == false","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x30,"void equality_suite::compare_null_equal_boolean_literal()",local_a,&local_4a);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_98);
  local_99 = false;
  local_5e[0] = trial::dynamic::operator!=(&local_98,&local_99);
  local_9a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable() != false","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x31,"void equality_suite::compare_null_equal_boolean_literal()",local_5e,&local_9a);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_98);
  local_9d = false;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_d8);
  local_9c[0] = trial::dynamic::operator==(&local_9d,&local_d8);
  local_d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("false == variable()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x32,"void equality_suite::compare_null_equal_boolean_literal()",local_9c,&local_d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_118);
  local_119 = true;
  local_db[0] = trial::dynamic::operator==(&local_118,&local_119);
  local_11a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable() == true","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x34,"void equality_suite::compare_null_equal_boolean_literal()",local_db,&local_11a);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_118);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_158);
  local_159 = true;
  local_11c[0] = trial::dynamic::operator!=(&local_158,&local_159);
  local_15a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable() != true","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x35,"void equality_suite::compare_null_equal_boolean_literal()",local_11c,&local_15a)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_158);
  local_15d = true;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_198);
  local_15c[0] = trial::dynamic::operator==(&local_15d,&local_198);
  local_199 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("true == variable()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x36,"void equality_suite::compare_null_equal_boolean_literal()",local_15c,&local_199)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_198);
  return;
}

Assistant:

void compare_null_equal_boolean_literal()
{
    TRIAL_PROTOCOL_TEST_EQUAL(variable() == false, false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable() != false, true);
    TRIAL_PROTOCOL_TEST_EQUAL(false == variable(), false);

    TRIAL_PROTOCOL_TEST_EQUAL(variable() == true, false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable() != true, true);
    TRIAL_PROTOCOL_TEST_EQUAL(true == variable(), false);
}